

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O3

void __thiscall wasm::LocalGraphFlower::prepareFlowBlocks(LocalGraphFlower *this)

{
  ulong *puVar1;
  pointer ppEVar2;
  __uniq_ptr_impl<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
  _Var3;
  undefined8 *puVar4;
  bool bVar5;
  pointer ppEVar6;
  pointer ppEVar7;
  pointer ppEVar8;
  size_t __new_size;
  pointer puVar9;
  mapped_type *ppFVar10;
  pointer pFVar11;
  _Head_base<0UL,_wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_false>
  _Var12;
  ulong uVar13;
  ulong uVar14;
  undefined8 *puVar15;
  pointer ppFVar16;
  BasicBlock *pBStack_48;
  BasicBlock *block;
  
  __new_size = Function::getNumLocals(this->func);
  std::vector<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
  ::resize(&this->flowBlocks,
           (long)(this->
                 super_CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>
                 ).basicBlocks.
                 super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->
                 super_CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>
                 ).basicBlocks.
                 super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3);
  std::vector<bool,_std::allocator<bool>_>::resize(&this->hasSet,__new_size,false);
  puVar9 = (this->
           super_CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>
           ).basicBlocks.
           super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->
      super_CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>
      ).basicBlocks.
      super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar9) {
    uVar13 = 0;
    uVar14 = 1;
    do {
      pBStack_48 = puVar9[uVar13]._M_t.
                   super___uniq_ptr_impl<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
                   .
                   super__Head_base<0UL,_wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_false>
                   ._M_head_impl;
      pFVar11 = (this->flowBlocks).
                super__Vector_base<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppFVar10 = std::
                 unordered_map<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_wasm::LocalGraphFlower::FlowBlock_*,_std::hash<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_wasm::LocalGraphFlower::FlowBlock_*>_>_>
                 ::operator[](&this->basicToFlowMap,&stack0xffffffffffffffb8);
      *ppFVar10 = pFVar11 + uVar13;
      puVar9 = (this->
               super_CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>
               ).basicBlocks.
               super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar5 = uVar14 < (ulong)((long)(this->
                                     super_CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>
                                     ).basicBlocks.
                                     super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 3)
      ;
      uVar13 = uVar14;
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (bVar5);
  }
  pFVar11 = (this->flowBlocks).
            super__Vector_base<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->flowBlocks).
      super__Vector_base<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
      ._M_impl.super__Vector_impl_data._M_finish != pFVar11) {
    uVar13 = 0;
    do {
      puVar9 = (this->
               super_CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>
               ).basicBlocks.
               super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pFVar11 = pFVar11 + uVar13;
      _Var12._M_head_impl =
           *(BasicBlock **)
            &puVar9[uVar13]._M_t.
             super___uniq_ptr_impl<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
             ._M_t;
      if (_Var12._M_head_impl ==
          (this->
          super_CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>
          ).entry) {
        this->entryFlowBlock = pFVar11;
        _Var12._M_head_impl =
             *(BasicBlock **)
              &puVar9[uVar13]._M_t.
               super___uniq_ptr_impl<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
               ._M_t;
      }
      pFVar11->lastTraversedIteration = 0xffffffffffffffff;
      ppEVar2 = (pFVar11->actions).
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      ppEVar6 = *(pointer *)((long)&(_Var12._M_head_impl)->contents + 8);
      ppEVar7 = (pFVar11->actions).
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppEVar8 = (pFVar11->actions).
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      (pFVar11->actions).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
      ._M_impl.super__Vector_impl_data._M_start = *(pointer *)&(_Var12._M_head_impl)->contents;
      (pFVar11->actions).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppEVar6;
      (pFVar11->actions).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           *(pointer *)((long)&(_Var12._M_head_impl)->contents + 0x10);
      *(pointer *)&(_Var12._M_head_impl)->contents = ppEVar7;
      *(pointer *)((long)&(_Var12._M_head_impl)->contents + 8) = ppEVar8;
      *(pointer *)((long)&(_Var12._M_head_impl)->contents + 0x10) = ppEVar2;
      _Var3._M_t.
      super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
      .
      super__Head_base<0UL,_wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_false>
      ._M_head_impl =
           puVar9[uVar13]._M_t.
           super___uniq_ptr_impl<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
           ._M_t;
      std::
      vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
      ::resize(&pFVar11->in,
               *(long *)((long)_Var3._M_t.
                               super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
                               .
                               super__Head_base<0UL,_wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_false>
                               ._M_head_impl + 0x70) -
               *(long *)((long)_Var3._M_t.
                               super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
                               .
                               super__Head_base<0UL,_wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_false>
                               ._M_head_impl + 0x68) >> 3);
      puVar15 = *(undefined8 **)
                 ((long)_Var3._M_t.
                        super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
                        .
                        super__Head_base<0UL,_wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_false>
                        ._M_head_impl + 0x68);
      puVar4 = *(undefined8 **)
                ((long)_Var3._M_t.
                       super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
                       .
                       super__Head_base<0UL,_wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_false>
                       ._M_head_impl + 0x70);
      if (puVar15 != puVar4) {
        ppFVar16 = (pFVar11->in).
                   super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        do {
          pBStack_48 = (BasicBlock *)*puVar15;
          ppFVar10 = std::
                     unordered_map<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_wasm::LocalGraphFlower::FlowBlock_*,_std::hash<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_wasm::LocalGraphFlower::FlowBlock_*>_>_>
                     ::operator[](&this->basicToFlowMap,(key_type *)&stack0xffffffffffffffb8);
          *ppFVar16 = *ppFVar10;
          puVar15 = puVar15 + 1;
          ppFVar16 = ppFVar16 + 1;
        } while (puVar15 != puVar4);
      }
      std::
      vector<std::pair<unsigned_int,_wasm::LocalSet_*>,_std::allocator<std::pair<unsigned_int,_wasm::LocalSet_*>_>_>
      ::reserve(&pFVar11->lastSets,
                *(size_type *)
                 ((long)puVar9[uVar13]._M_t.
                        super___uniq_ptr_impl<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
                        ._M_t + 0x30));
      for (puVar15 = *(undefined8 **)
                      ((long)puVar9[uVar13]._M_t.
                             super___uniq_ptr_impl<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
                             ._M_t + 0x28); puVar15 != (undefined8 *)0x0;
          puVar15 = (undefined8 *)*puVar15) {
        pBStack_48 = (BasicBlock *)puVar15[1];
        block = (BasicBlock *)puVar15[2];
        std::
        vector<std::pair<unsigned_int,wasm::LocalSet*>,std::allocator<std::pair<unsigned_int,wasm::LocalSet*>>>
        ::emplace_back<std::pair<unsigned_int_const,wasm::LocalSet*>&>
                  ((vector<std::pair<unsigned_int,wasm::LocalSet*>,std::allocator<std::pair<unsigned_int,wasm::LocalSet*>>>
                    *)&pFVar11->lastSets,
                   (pair<const_unsigned_int,_wasm::LocalSet_*> *)&stack0xffffffffffffffb8);
        puVar1 = (this->hasSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                 ((ulong)pBStack_48 >> 6 & 0x3ffffff);
        *puVar1 = *puVar1 | 1L << ((byte)pBStack_48 & 0x3f);
      }
      uVar13 = (ulong)((int)uVar13 + 1);
      pFVar11 = (this->flowBlocks).
                super__Vector_base<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar14 = ((long)(this->flowBlocks).
                      super__Vector_base<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar11 >> 4) *
               -0x3333333333333333;
    } while (uVar13 <= uVar14 && uVar14 - uVar13 != 0);
  }
  if (this->entryFlowBlock == (FlowBlock *)0x0) {
    __assert_fail("entryFlowBlock != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/LocalGraph.cpp"
                  ,0xb2,"void wasm::LocalGraphFlower::prepareFlowBlocks()");
  }
  return;
}

Assistant:

void prepareFlowBlocks() {
    auto numLocals = func->getNumLocals();

    // Convert input blocks (basicBlocks) into more efficient flow blocks to
    // improve memory access.
    flowBlocks.resize(basicBlocks.size());

    hasSet.resize(numLocals, false);

    // Init mapping between basicblocks and flowBlocks
    for (Index i = 0; i < basicBlocks.size(); ++i) {
      auto* block = basicBlocks[i].get();
      basicToFlowMap[block] = &flowBlocks[i];
    }

    for (Index i = 0; i < flowBlocks.size(); ++i) {
      auto& block = basicBlocks[i];
      auto& flowBlock = flowBlocks[i];
      // Get the equivalent block to entry in the flow list
      if (block.get() == entry) {
        entryFlowBlock = &flowBlock;
      }
      flowBlock.lastTraversedIteration = FlowBlock::NULL_ITERATION;
      flowBlock.actions.swap(block->contents.actions);
      // Map in block to flow blocks
      auto& in = block->in;
      flowBlock.in.resize(in.size());
      std::transform(in.begin(),
                     in.end(),
                     flowBlock.in.begin(),
                     [&](BasicBlock* block) { return basicToFlowMap[block]; });
      // Convert unordered_map to vector.
      flowBlock.lastSets.reserve(block->contents.lastSets.size());
      for (auto set : block->contents.lastSets) {
        flowBlock.lastSets.emplace_back(set);
        hasSet[set.first] = true;
      }
    }
    assert(entryFlowBlock != nullptr);
  }